

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_7.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  istream *this;
  ulong uVar5;
  ostream *poVar6;
  long lVar7;
  int N;
  int R;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&N);
  std::istream::operator>>(this,&R);
  if (N < 0) {
    std::operator<<((ostream *)&std::cout,"-");
    N = -N;
  }
  uVar5 = (ulong)(uint)N;
  lVar7 = 0;
  while (iVar4 = (int)uVar5, iVar4 != 0) {
    uVar1 = (long)iVar4 / (long)R;
    uVar5 = uVar1 & 0xffffffff;
    lVar2 = (long)iVar4 % (long)R;
    cVar3 = '7';
    if ((int)lVar2 < 10) {
      cVar3 = '0';
    }
    num[lVar7] = cVar3 + (char)lVar2;
    lVar7 = lVar7 + 1;
    N = (int)uVar1;
  }
  if (lVar7 == 0) {
    std::ostream::operator<<((ostream *)&std::cout,0);
  }
  for (; 0 < lVar7; lVar7 = lVar7 + -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,num[lVar7]);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return 0;
}

Assistant:

int main()
{
    int m,N,R,now;
    std::cin >> N >> R;
    if(N < 0){
        std::cout << "-";
        N = -N;
    }
    m = 0;
    while (N)           //转换进制，先求余在，在除，最后倒序输出
    {
        now = N % R;
        if(now <= 9)
        {
            num[m++] = '0' + now; //'0'表示把数字转换成char类型的数字
        }else
        {
            num[m++] = 'A' + now - 10;  //把now转换成大写字母
        }
        N /= R;
    }
    if(m == 0)
    {
        std::cout << 0;
    }
    for (int i = m ; i > 0; i--) {     //进制转换以后要倒序输出，才是转换后的结果。
        std::cout << num[i] << std::endl;
    }
    return 0;
}